

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codeholder.cpp
# Opt level: O2

Error __thiscall
asmjit::v1_14::CodeHolder::bindLabel
          (CodeHolder *this,Label *label,uint32_t toSectionId,uint64_t toOffset)

{
  uint64_t *puVar1;
  uint uVar2;
  LabelEntry *pLVar3;
  Section *pSVar4;
  RelocEntry *pRVar5;
  ulong uVar6;
  ulong uVar7;
  bool bVar8;
  LabelEntry **ppLVar9;
  Section **ppSVar10;
  RelocEntry **ppRVar11;
  Error local_4c;
  LabelLinkIterator link;
  
  uVar2 = (label->super_Operand).super_Operand_._baseId;
  local_4c = 0xc;
  if (uVar2 < *(uint *)&this->field_0x100) {
    ppLVar9 = ZoneVector<asmjit::v1_14::LabelEntry_*>::operator[](&this->_labelEntries,(ulong)uVar2)
    ;
    pLVar3 = *ppLVar9;
    if (pLVar3 != (LabelEntry *)0x0) {
      if (*(uint *)&this->field_0xe0 < toSectionId) {
        local_4c = 0x13;
      }
      else if (pLVar3->_section == (Section *)0x0) {
        ppSVar10 = ZoneVector<asmjit::v1_14::Section_*>::operator[]
                             (&this->_sections,(ulong)toSectionId);
        pSVar4 = *ppSVar10;
        pLVar3->_section = pSVar4;
        pLVar3->_offset = toOffset;
        link._pPrev = &pLVar3->_links;
        local_4c = 0;
        link._link = pLVar3->_links;
        while (link._link != (LabelLink *)0x0) {
          if ((ulong)(link._link)->relocId == 0xffffffff) {
            if ((link._link)->sectionId == toSectionId) {
              uVar6 = (link._link)->offset;
              uVar7 = (pSVar4->_buffer)._size;
              if (uVar7 <= uVar6) {
                DebugUtils::assertionFailed
                          ("/workspace/llm4binary/github/license_c_cmakelists/asmjit[P]asmjit/src/asmjit/core/codeholder.cpp"
                           ,0x2e1,"linkOffset < buf.size()");
              }
              if (uVar7 - uVar6 < (ulong)((link._link)->format)._regionSize) {
                DebugUtils::assertionFailed
                          ("/workspace/llm4binary/github/license_c_cmakelists/asmjit[P]asmjit/src/asmjit/core/codeholder.cpp"
                           ,0x2e5,"buf.size() - size_t(linkOffset) >= link->format.regionSize()");
              }
              bVar8 = CodeWriterUtils::writeOffset
                                ((pSVar4->_buffer)._data + uVar6,
                                 (toOffset - uVar6) + (link._link)->rel,&(link._link)->format);
              if (bVar8) goto LAB_00111e0b;
              link._pPrev = &(link._link)->next;
              local_4c = 0x30;
              link._link = (link._link)->next;
            }
            else {
              link._pPrev = &(link._link)->next;
              link._link = (link._link)->next;
            }
          }
          else {
            ppRVar11 = ZoneVector<asmjit::v1_14::RelocEntry_*>::operator[]
                                 (&this->_relocations,(ulong)(link._link)->relocId);
            pRVar5 = *ppRVar11;
            puVar1 = &pRVar5->_payload;
            *puVar1 = *puVar1 + toOffset;
            pRVar5->_targetSectionId = toSectionId;
LAB_00111e0b:
            LabelLinkIterator::resolveAndNext(&link,this);
          }
        }
      }
      else {
        local_4c = 0xe;
      }
    }
  }
  return local_4c;
}

Assistant:

ASMJIT_API Error CodeHolder::bindLabel(const Label& label, uint32_t toSectionId, uint64_t toOffset) noexcept {
  LabelEntry* le = labelEntry(label);
  if (ASMJIT_UNLIKELY(!le))
    return DebugUtils::errored(kErrorInvalidLabel);

  if (ASMJIT_UNLIKELY(toSectionId > _sections.size()))
    return DebugUtils::errored(kErrorInvalidSection);

  // Label can be bound only once.
  if (ASMJIT_UNLIKELY(le->isBound()))
    return DebugUtils::errored(kErrorLabelAlreadyBound);

  // Bind the label.
  Section* section = _sections[toSectionId];
  le->_section = section;
  le->_offset = toOffset;

  Error err = kErrorOk;
  CodeBuffer& buf = section->buffer();

  // Fix all links to this label we have collected so far if they are within
  // the same section. We ignore any inter-section links as these have to be
  // fixed later.
  LabelLinkIterator link(le);
  while (link) {
    uint32_t linkSectionId = link->sectionId;
    size_t linkOffset = link->offset;

    uint32_t relocId = link->relocId;
    if (relocId != Globals::kInvalidId) {
      // Adjust relocation data only.
      RelocEntry* re = _relocations[relocId];
      re->_payload += toOffset;
      re->_targetSectionId = toSectionId;
    }
    else {
      if (linkSectionId != toSectionId) {
        link.next();
        continue;
      }

      ASMJIT_ASSERT(linkOffset < buf.size());
      int64_t displacement = int64_t(toOffset - uint64_t(linkOffset) + uint64_t(int64_t(link->rel)));

      // Size of the value we are going to patch. Only BYTE/DWORD is allowed.
      ASMJIT_ASSERT(buf.size() - size_t(linkOffset) >= link->format.regionSize());

      // Overwrite a real displacement in the CodeBuffer.
      if (!CodeWriterUtils::writeOffset(buf._data + linkOffset, displacement, link->format)) {
        err = DebugUtils::errored(kErrorInvalidDisplacement);
        link.next();
        continue;
      }
    }

    link.resolveAndNext(this);
  }

  return err;
}